

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall HEkk::debugBasisCorrect(HEkk *this,HighsLp *lp)

{
  HighsOptions *pHVar1;
  HighsDebugStatus HVar2;
  HighsDebugStatus HVar3;
  
  pHVar1 = this->options_;
  if ((pHVar1->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar3 = kNotChecked;
  }
  else {
    HVar2 = debugBasisConsistent(this);
    HVar3 = kOk;
    if (HVar2 == kLogicalError) {
      highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                  "Supposed to be a Simplex basis, but not consistent\n");
      HVar3 = kLogicalError;
    }
    if (1 < (pHVar1->super_HighsOptionsStruct).highs_debug_level) {
      HVar2 = debugNonbasicMove(this,lp);
      if (HVar2 == kLogicalError) {
        HVar3 = kLogicalError;
        highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                    "Supposed to be a Simplex basis, but nonbasicMove is incorrect\n");
      }
    }
  }
  return HVar3;
}

Assistant:

HighsDebugStatus HEkk::debugBasisCorrect(const HighsLp* lp) const {
  // Nontrivially expensive analysis of a Simplex basis, checking
  // consistency, and then correctness of nonbasicMove
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const bool consistent =
      this->debugBasisConsistent() != HighsDebugStatus::kLogicalError;
  if (!consistent) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "Supposed to be a Simplex basis, but not consistent\n");
    assert(consistent);
    return_status = HighsDebugStatus::kLogicalError;
  }
  if (options.highs_debug_level < kHighsDebugLevelCostly) return return_status;
  const bool correct_nonbasicMove =
      this->debugNonbasicMove(lp) != HighsDebugStatus::kLogicalError;
  if (!correct_nonbasicMove) {
    highsLogDev(
        options.log_options, HighsLogType::kError,
        "Supposed to be a Simplex basis, but nonbasicMove is incorrect\n");
    assert(correct_nonbasicMove);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}